

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O0

uchar chaiscript::bootstrap::parse_string<unsigned_char>(string *i)

{
  _Ios_Openmode _Var1;
  uchar local_199;
  stringstream local_198 [7];
  uchar t;
  stringstream ss;
  string *i_local;
  
  _Var1 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_198,(string *)i,_Var1);
  std::operator>>((istream *)local_198,&local_199);
  std::__cxx11::stringstream::~stringstream(local_198);
  return local_199;
}

Assistant:

Input parse_string(const std::string &i) {
    if constexpr (!std::is_same<Input, wchar_t>::value && !std::is_same<Input, char16_t>::value && !std::is_same<Input, char32_t>::value) {
      std::stringstream ss(i);
      Input t;
      ss >> t;
      return t;
    } else {
      throw std::runtime_error("Parsing of wide characters is not yet supported");
    }
  }